

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O2

InputParameter<3UL,_ruckig::StandardVector> * __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::operator=
          (InputParameter<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *param_1)

{
  bool bVar1;
  undefined7 uVar2;
  long lVar3;
  optional<std::array<double,_3UL>_> *poVar4;
  optional<std::array<double,_3UL>_> *poVar5;
  byte bVar6;
  
  bVar6 = 0;
  memcpy(this,param_1,0x130);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::operator=
            (&this->intermediate_positions,&param_1->intermediate_positions);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&this->per_section_max_velocity,
                   (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&param_1->per_section_max_velocity);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&this->per_section_max_acceleration,
                   (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&param_1->per_section_max_acceleration);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&this->per_section_max_jerk,
                   (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&param_1->per_section_max_jerk);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&this->per_section_min_velocity,
                   (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&param_1->per_section_min_velocity);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&this->per_section_min_acceleration,
                   (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&param_1->per_section_min_acceleration);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&this->per_section_max_position,
                   (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&param_1->per_section_max_position);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&this->per_section_min_position,
                   (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)&param_1->per_section_min_position);
  poVar4 = &param_1->max_position;
  poVar5 = &this->max_position;
  for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
    (poVar5->super__Optional_base<std::array<double,_3UL>,_true,_true>)._M_payload.
    super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[0] =
         (poVar4->super__Optional_base<std::array<double,_3UL>,_true,_true>)._M_payload.
         super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[0];
    poVar4 = (optional<std::array<double,_3UL>_> *)((long)poVar4 + (ulong)bVar6 * -0x10 + 8);
    poVar5 = (optional<std::array<double,_3UL>_> *)((long)poVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  std::_Optional_payload_base<std::vector<double,_std::allocator<double>_>_>::_M_copy_assign
            ((_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &this->per_section_minimum_duration,
             (_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &param_1->per_section_minimum_duration);
  bVar1 = (param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>.
          _M_payload.super__Optional_payload_base<double>._M_engaged;
  uVar2 = *(undefined7 *)
           &(param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>.
            _M_payload.super__Optional_payload_base<double>.field_0x9;
  (this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload =
       (param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload
       .super__Optional_payload_base<double>._M_payload;
  (this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_engaged = bVar1;
  *(undefined7 *)
   &(this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>.field_0x9 = uVar2;
  return this;
}

Assistant:

inline static double v_at_a_zero(double v0, double a0, double j) {
        return v0 + (a0 * a0) / (2 * j);
    }